

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.cpp
# Opt level: O1

void __thiscall
duckdb::roaring::RoaringCompressState::RoaringCompressState
          (RoaringCompressState *this,ColumnDataCheckpointData *checkpoint_data,
          unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true>
          *analyze_state_p)

{
  pointer pAVar1;
  RoaringAnalyzeState *pRVar2;
  CompressionFunction *pCVar3;
  RowGroup *pRVar4;
  pointer *__ptr;
  
  pAVar1 = unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true>::
           operator->(analyze_state_p);
  (this->super_CompressionState)._vptr_CompressionState =
       (_func_int **)&PTR__CompressionState_0248e128;
  (this->super_CompressionState).info.block_manager = (pAVar1->info).block_manager;
  (this->super_CompressionState)._vptr_CompressionState =
       (_func_int **)&PTR__RoaringCompressState_0248e248;
  (this->owned_analyze_state).
  super_unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>._M_t.
  super___uniq_ptr_impl<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::AnalyzeState_*,_std::default_delete<duckdb::AnalyzeState>_>.
  super__Head_base<0UL,_duckdb::AnalyzeState_*,_false>._M_head_impl =
       (analyze_state_p->
       super_unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>)._M_t.
       super___uniq_ptr_impl<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::AnalyzeState_*,_std::default_delete<duckdb::AnalyzeState>_>.
       super__Head_base<0UL,_duckdb::AnalyzeState_*,_false>._M_head_impl;
  (analyze_state_p->
  super_unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>)._M_t.
  super___uniq_ptr_impl<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::AnalyzeState_*,_std::default_delete<duckdb::AnalyzeState>_>.
  super__Head_base<0UL,_duckdb::AnalyzeState_*,_false>._M_head_impl = (AnalyzeState *)0x0;
  pRVar2 = (RoaringAnalyzeState *)
           unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true>::
           operator->(&this->owned_analyze_state);
  this->analyze_state = pRVar2;
  ContainerCompressionState::ContainerCompressionState(&this->container_state);
  ContainerMetadataCollection::ContainerMetadataCollection(&this->metadata_collection);
  this->container_metadata = &this->analyze_state->container_metadata;
  this->checkpoint_data = checkpoint_data;
  pCVar3 = ColumnDataCheckpointData::GetCompressionFunction(checkpoint_data,COMPRESSION_ROARING);
  this->function = pCVar3;
  (this->current_segment).
  super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
  super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>.
  super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl = (ColumnSegment *)0x0;
  BufferHandle::BufferHandle(&this->handle);
  this->total_count = 0;
  pRVar4 = ColumnDataCheckpointData::GetRowGroup(checkpoint_data);
  CreateEmptySegment(this,(pRVar4->super_SegmentBase<duckdb::RowGroup>).start);
  this->total_count = 0;
  InitializeContainer(this);
  return;
}

Assistant:

RoaringCompressState::RoaringCompressState(ColumnDataCheckpointData &checkpoint_data,
                                           unique_ptr<AnalyzeState> analyze_state_p)
    : CompressionState(analyze_state_p->info), owned_analyze_state(std::move(analyze_state_p)),
      analyze_state(owned_analyze_state->Cast<RoaringAnalyzeState>()), container_state(),
      container_metadata(analyze_state.container_metadata), checkpoint_data(checkpoint_data),
      function(checkpoint_data.GetCompressionFunction(CompressionType::COMPRESSION_ROARING)) {
	CreateEmptySegment(checkpoint_data.GetRowGroup().start);
	total_count = 0;
	InitializeContainer();
}